

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLDocumentProcessor.h
# Opt level: O2

void __thiscall COLLADASaxFWL::DocumentProcessor::addCamera(DocumentProcessor *this,Camera *camera)

{
  Camera *local_8;
  
  local_8 = camera;
  std::vector<COLLADAFW::Camera_*,_std::allocator<COLLADAFW::Camera_*>_>::push_back
            (this->mCameras,&local_8);
  return;
}

Assistant:

void addCamera( COLLADAFW::Camera* camera ) { mCameras.push_back(camera); }